

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  pAVar1 = GetArena(this);
  local_61 = 0;
  if (pAVar1 != (Arena *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5ac);
    local_61 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: GetArena() == nullptr: ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"ExtractSubrange() when arena is non-nullptr is only supported when "
                       );
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,"the Element type supplies a MergeFrom() operation to make copies.");
    internal::LogFinisher::operator=(local_75,pLVar2);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  UnsafeArenaExtractSubrange(this,elements_local._4_4_,(int)elements_local,local_28);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::false_type) {
  // This case is identical to UnsafeArenaExtractSubrange(). However, since
  // ExtractSubrange() must return heap-allocated objects by contract, and we
  // cannot fulfill this contract if we are an on arena, we must GOOGLE_DCHECK() that
  // we are not on an arena.
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ExtractSubrange() when arena is non-nullptr is only supported when "
      << "the Element type supplies a MergeFrom() operation to make copies.";
  UnsafeArenaExtractSubrange(start, num, elements);
}